

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

QString * __thiscall
QUrlQuery::query(QString *__return_storage_ptr__,QUrlQuery *this,ComponentFormattingOptions encoding
                )

{
  ArrayOptions *pAVar1;
  undefined2 ch;
  QUrlQueryPrivate *pQVar2;
  pair<QString,_QString> *ppVar3;
  long lVar4;
  Data *pDVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong alloc;
  pair<QString,_QString> *input;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  uint local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == (QUrlQueryPrivate *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    uVar8._0_2_ = pQVar2->valueDelimiter;
    uVar8._2_2_ = pQVar2->pairDelimiter;
    auVar10 = pshuflw(ZEXT416(uVar8),ZEXT416(uVar8),0xe1);
    local_40[0] = auVar10._0_4_ | (uint)DAT_004cd020;
    local_40[1] = 0;
    if (((uint)encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
               super_QFlagsStorage<QUrl::ComponentFormattingOption>.i & 0xc00000) != 0) {
      local_40[1] = 0x223;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    ppVar3 = (pQVar2->itemList).d.ptr;
    lVar4 = (pQVar2->itemList).d.size;
    alloc = 0;
    iVar6 = 0;
    if (lVar4 != 0) {
      lVar9 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + *(int *)((long)&(ppVar3->first).d.size + lVar9) +
                        *(int *)((long)&(ppVar3->second).d.size + lVar9) + 2;
        lVar9 = lVar9 + 0x30;
      } while (lVar4 * 0x30 != lVar9);
    }
    iVar7 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    uVar8 = (iVar7 >> 2) + iVar6;
    if (0 < (int)uVar8) {
      alloc = (ulong)uVar8;
    }
    QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
    pDVar5 = (__return_storage_ptr__->d).d;
    if ((pDVar5 != (Data *)0x0) && ((pDVar5->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar5->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    input = (((this->d).d.ptr)->itemList).d.ptr;
    if (input != ppVar3 + lVar4) {
      do {
        if ((__return_storage_ptr__->d).size != 0) {
          QString::append(__return_storage_ptr__,(QChar)(((this->d).d.ptr)->pairDelimiter).ucs);
        }
        recodeAndAppend(__return_storage_ptr__,&input->first,encoding,(ushort *)local_40);
        if ((input->second).d.ptr != (char16_t *)0x0) {
          ch = ((this->d).d.ptr)->valueDelimiter;
          QString::append(__return_storage_ptr__,(QChar)ch);
          recodeAndAppend(__return_storage_ptr__,&input->second,encoding,(ushort *)local_40);
        }
        input = input + 1;
      } while (input != ppVar3 + lVar4);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QUrlQuery::query(QUrl::ComponentFormattingOptions encoding) const
{
    if (!d)
        return QString();

    // unlike the component encoding, for the whole query we need to modify a little:
    //  - the "#" character is unambiguous, so we encode it in EncodeDelimiters mode
    //  - the query delimiter pair must always be encoded

    // start with what's always encoded
    ushort tableActions[] = {
        encode(d->pairDelimiter.unicode()),  // 0
        encode(d->valueDelimiter.unicode()), // 1
        0,                                   // 2
        0
    };
    if (encoding & QUrl::EncodeDelimiters) {
        tableActions[2] = encode('#');
    }

    QString result;
    Map::const_iterator it = d->itemList.constBegin();
    Map::const_iterator end = d->itemList.constEnd();

    {
        int size = 0;
        for ( ; it != end; ++it)
            size += it->first.size() + 1 + it->second.size() + 1;
        result.reserve(size + size / 4);
    }

    for (it = d->itemList.constBegin(); it != end; ++it) {
        if (!result.isEmpty())
            result += QChar(d->pairDelimiter);
        recodeAndAppend(result, it->first, encoding, tableActions);
        if (!it->second.isNull()) {
            result += QChar(d->valueDelimiter);
            recodeAndAppend(result, it->second, encoding, tableActions);
        }
    }
    return result;
}